

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

void __thiscall CVmDynFuncSymtab::~CVmDynFuncSymtab(CVmDynFuncSymtab *this)

{
  CTcPrsSymtab::~CTcPrsSymtab(&this->super_CTcPrsSymtab);
  operator_delete(this,0x40);
  return;
}

Assistant:

class CVmDynFuncSymtab: public CTcPrsSymtab
{
public:
    /* initialize with a source object */
    CVmDynFuncSymtab(VMG_ vm_obj_id_t globals, vm_obj_id_t locals)
        : CTcPrsSymtab(0)
    {
        /* remember the globals */
        gptr_ = VMGLOB_ADDR;

        /* remember my symbol table objects */
        globals_ = globals;
        locals_ = locals;
    }

    /* find a symbol - implementation of CTcPrsDbgSymtab interface */
    virtual CTcSymbol *find_direct(const textchar_t *sym, size_t len)
    {
        /* first, check the cache to see if we've already looked it up */
        CTcSymbol *ret = CTcPrsSymtab::find_direct(sym, len);
        if (ret != 0)
            return ret;

        /* 
         *   Didn't find it - check the user-code tables.
         */

        /* try our local symbol table */
        ret = find_local(sym, len);

        /* if that didn't work, try our global symbol table */
        if (ret == 0)
            ret = find_global(sym, len);

        /* if we found a symbol, add it to the cache */
        if (ret != 0)
            CTcPrsSymtab::add_entry(ret);

        /* return the symbol */
        return ret;
    }

    /* add an entry */
    virtual void add_entry(CTcSymbol *sym)
    {
        /* flag an error */
        G_tok->log_error(TCERR_RT_CANNOT_DEFINE_GLOBALS,
                         (int)sym->get_sym_len(), sym->get_sym());
    }
    
private:
    /* look up a symbol in our local symbol table */
    CTcSymbol *find_local(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (locals_ == VM_INVALID_OBJ)
            return 0;

        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* 
         *   if it's a StackFrameDesc object, look up the symbol; otherwise
         *   try to treat it as a list-like object, and check each element of
         *   the list 
         */
        if (CVmObjFrameDesc::is_framedesc_obj(vmg_ locals_))
        {
            /* look up the value in our single table */
            return find_local(sym, len, locals_);
        }
        else
        {
            /* assume it's a list - set up an object value */
            vm_val_t lt;
            lt.set_obj(locals_);
            
            /* check each list element */
            int n = lt.ll_length(vmg0_);
            for (int i = 1 ; i <= n ; ++i)
            {
                /* get this element */
                vm_val_t ele;
                lt.ll_index(vmg_ &ele, i);

                /* if it's a StackFrameDesc object, check it */
                if (ele.typ == VM_OBJ
                    && CVmObjFrameDesc::is_framedesc_obj(vmg_ ele.val.obj))
                {
                    /* look up the value in this table */
                    CTcSymbol *ret = find_local(sym, len, ele.val.obj);

                    /* if we found it, return the value */
                    if (ret != 0)
                        return ret;
                }
            }

            /* we didn't find a value */
            return 0;
        }
    }

    /* find a symbol in a given local table */
    CTcSymbol *find_local(const textchar_t *sym, size_t len, vm_obj_id_t fref)
    {
        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* get the frame descriptor object */
        CVmObjFrameDesc *fp = (CVmObjFrameDesc *)vm_objp(vmg_ fref);

        /* look up the symbol */
        CVmDbgFrameSymPtr info;
        if (fp->find_local(vmg_ sym, len, &info))
        {
            /* return a new dynamic local symbol */
            return new CTcSymDynLocal(
                sym, len, FALSE, fp->get_frame_ref_id(),
                fp->get_frame_ref(vmg0_)->get_var_frame_index(&info),
                info.is_ctx_local() ? info.get_ctx_arr_idx() : 0);
        }

        /* didn't find it - return failure */
        return 0;
    }